

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestFunctions.cpp
# Opt level: O0

void __thiscall Two3KExpSinCos::eval(Two3KExpSinCos *this,double *x,double *y)

{
  double dVar1;
  int local_2c;
  int local_28;
  int i_2;
  int i_1;
  int i;
  double *y_local;
  double *x_local;
  Two3KExpSinCos *this_local;
  
  for (i_2 = 0; i_2 < 0x401; i_2 = i_2 + 1) {
    dVar1 = exp(*x + x[1]);
    y[i_2] = dVar1;
  }
  for (local_28 = 0x401; local_28 < 0x807; local_28 = local_28 + 1) {
    dVar1 = sin(*x + x[1]);
    y[local_28] = dVar1 + 1.0;
  }
  for (local_2c = 0x807; local_2c < 0xc00; local_2c = local_2c + 1) {
    dVar1 = cos(*x * 3.0 + x[1]);
    y[local_2c] = dVar1;
  }
  return;
}

Assistant:

void Two3KExpSinCos::eval(const double x[], double y[]) const{
    for(int i=0; i<1025; i++){
        y[i] = std::exp(x[0] + x[1]);
    }
    for(int i=1025; i<2055; i++){
        y[i] = std::sin(x[0] + x[1]) + 1.0;
    }
    for(int i=2055; i<3072; i++){
        y[i] = std::cos(3.0*x[0] + x[1]);
    }
}